

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::TryGetValueAndRemove
          (SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  uint uVar1;
  int *piVar2;
  ValueEntry<bool,_JsUtil::(anonymous_namespace)::ValueEntryData<bool>_> *pVVar3;
  TBKey pRVar4;
  int iVar5;
  ulong uVar6;
  int unaff_R12D;
  ulong uVar7;
  bool bVar8;
  uint local_34;
  
  piVar2 = (this->buckets).ptr;
  if (piVar2 == (int *)0x0) {
    bVar8 = false;
    uVar6 = 0;
  }
  else {
    local_34 = PrimePolicy::ModPrime
                         ((uint)((ulong)*key >> 4) & 0x7fffffff,this->bucketCount,
                          this->modFunctionIndex);
    uVar1 = piVar2[local_34];
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      unaff_R12D = -1;
      bVar8 = false;
    }
    else {
      pVVar3 = (this->entries).ptr;
      uVar7 = 0xffffffff;
      do {
        iVar5 = (int)uVar6;
        pRVar4 = (this->weakRefs).ptr[uVar6].ptr;
        if (pRVar4 == (TBKey)0x0) {
          uVar6 = (ulong)(uint)(this->entries).ptr[uVar6].super_ValueEntryData<bool>.next;
          RemoveAt(this,iVar5,(int)uVar7,local_34);
          iVar5 = 3;
        }
        else if (pRVar4 == *key) {
          iVar5 = 1;
        }
        else {
          iVar5 = 0;
          uVar7 = uVar6;
          uVar6 = (ulong)(uint)pVVar3[uVar6].super_ValueEntryData<bool>.next;
        }
        unaff_R12D = (int)uVar7;
        if ((iVar5 != 3) && (iVar5 != 0)) goto LAB_00d368f3;
      } while (-1 < (int)uVar6);
      iVar5 = 0;
LAB_00d368f3:
      bVar8 = iVar5 != 0;
    }
  }
  if (bVar8 != false) {
    *value = (this->entries).ptr[(int)uVar6].super_ValueEntryData<bool>.value;
    RemoveAt(this,(int)uVar6,unaff_R12D,local_34);
  }
  return bVar8;
}

Assistant:

bool TryGetValueAndRemove(const TBKey& key, TBValue* value)
        {
            int i, last;
            uint targetBucket;
            if (FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                *value = this->GetValue(i);
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }